

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_or_null.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ConstantOrNullBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  type expr;
  undefined8 *puVar4;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  Value value;
  Value local_a8;
  Value local_68;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
  if ((char)iVar1 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
  if ((char)iVar1 != '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar2);
    ExpressionExecutor::EvaluateScalar(&local_68,context,expr,false);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar3->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar3->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar3->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar3->return_type).type_info_);
    }
    puVar4 = (undefined8 *)operator_new(0x48);
    Value::Value(&local_a8,&local_68);
    *puVar4 = &PTR__ConstantOrNullBindData_0243cdc8;
    Value::Value((Value *)(puVar4 + 1),&local_a8);
    Value::~Value(&local_a8);
    *(undefined8 **)this = puVar4;
    Value::~Value(&local_68);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_a8.type_._0_8_ = (long)&local_a8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"ConstantOrNull requires a constant input","");
  BinderException::BinderException(this_01,(string *)&local_a8);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> ConstantOrNullBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[0]->IsFoldable()) {
		throw BinderException("ConstantOrNull requires a constant input");
	}
	D_ASSERT(arguments.size() >= 2);
	auto value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<ConstantOrNullBindData>(std::move(value));
}